

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

StringPair *
icu_63::StringPair::create(UnicodeString *displayName,UnicodeString *id,UErrorCode *status)

{
  StringPair *this;
  UnicodeString *p;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    p = id;
    this = (StringPair *)UMemory::operator_new((UMemory *)0x88,(size_t)id);
    if (this == (StringPair *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      StringPair(this,displayName,id);
      if ((((this->id).fUnion.fStackFields.fLengthAndFlags |
           (this->displayName).fUnion.fStackFields.fLengthAndFlags) & 1U) == 0) {
        return this;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      UnicodeString::~UnicodeString(&this->id);
      UnicodeString::~UnicodeString(&this->displayName);
      p = displayName;
    }
    UMemory::operator_delete((UMemory *)this,p);
  }
  return (StringPair *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result) const 
{
    return getDisplayName(id, result, Locale::getDefault());
}